

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall ThreadedReplayer::tear_down_threads(ThreadedReplayer *this)

{
  pointer ptVar1;
  int iVar2;
  pointer ptVar3;
  thread *thread;
  pointer ptVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->pipeline_work_queue_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  this->shutting_down = true;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)&this->pipeline_work_queue_mutex);
  ptVar4 = (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
           .super__Vector_impl_data._M_start;
  ptVar1 = (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (ptVar4 != ptVar1) {
    do {
      if ((ptVar4->_M_id)._M_thread != 0) {
        std::thread::join();
      }
      ptVar4 = ptVar4 + 1;
    } while (ptVar4 != ptVar1);
    ptVar4 = (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar1 = (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ptVar3 = ptVar4;
    if (ptVar1 != ptVar4) {
      do {
        if ((ptVar3->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar3 = ptVar3 + 1;
      } while (ptVar3 != ptVar1);
      (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar4;
    }
  }
  return;
}

Assistant:

void tear_down_threads()
	{
		// Signal that it's time for threads to die.
		{
			lock_guard<mutex> lock(pipeline_work_queue_mutex);
			shutting_down = true;
			work_available_condition.notify_all();
		}

		for (auto &thread : thread_pool)
			if (thread.joinable())
				thread.join();
		thread_pool.clear();
	}